

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenEmbeddedIncludes(CppGenerator *this)

{
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string file_path;
  CppGenerator *this_local;
  
  if ((((((this->super_BaseGenerator).parser_)->opts).binary_schema_gen_embed & 1U) != 0) &&
     (((this->super_BaseGenerator).parser_)->root_struct_def_ != (StructDef *)0x0)) {
    file_path.field_2._8_8_ = this;
    std::operator+(&local_50,(this->super_BaseGenerator).file_name_,"_bfbs");
    BaseGenerator::GeneratedFileName
              ((string *)local_30,&this->super_BaseGenerator,
               &(this->opts_).super_IDLOptions.include_prefix,&local_50,
               &(this->opts_).super_IDLOptions);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"// For access to the binary schema that produced this file.",
               &local_81);
    CodeWriter::operator+=(&this->code_,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::operator+(&local_c8,"#include \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::operator+(&local_a8,&local_c8,"\"");
    CodeWriter::operator+=(&this->code_,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    CodeWriter::operator+=(&this->code_,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void GenEmbeddedIncludes() {
    if (parser_.opts.binary_schema_gen_embed && parser_.root_struct_def_) {
      const std::string file_path =
          GeneratedFileName(opts_.include_prefix, file_name_ + "_bfbs", opts_);
      code_ += "// For access to the binary schema that produced this file.";
      code_ += "#include \"" + file_path + "\"";
      code_ += "";
    }
  }